

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_heter_queue.h
# Opt level: O0

put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
density::
lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)0>
::try_start_emplace<std::__cxx11::string,int,char>
          (put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,
          lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)0>
          *this,progress_guarantee i_progress_guarantee,int *i_construction_params,
          char *i_construction_params_1)

{
  char cVar1;
  int iVar2;
  runtime_type<> *prVar3;
  runtime_type<> rVar4;
  put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8;
  allocator local_81;
  runtime_type<> *local_80;
  runtime_type<> *type_storage;
  runtime_type *type;
  undefined1 local_68 [7];
  bool is_noexcept;
  undefined1 local_48 [8];
  Allocation push_data;
  char *i_construction_params_local_1;
  int *i_construction_params_local;
  progress_guarantee i_progress_guarantee_local;
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
  *this_local;
  
  push_data.m_user_storage = i_construction_params_1;
  detail::
  LFQueue_Base<density::runtime_type<>,density::basic_default_allocator<65536ul>,density::detail::LFQueue_Tail<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::consistency_model)0>>
  ::try_inplace_allocate<1ul,true,32ul,8ul>((Allocation *)local_48,this,i_progress_guarantee);
  if (push_data.m_next_ptr == 0) {
    memset(local_68,0,0x20);
    lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
    ::
    put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::put_transaction((put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_68);
    put_transaction<std::__cxx11::string>::put_transaction<std::__cxx11::string,void>
              ((put_transaction<std::__cxx11::string> *)__return_storage_ptr__,
               (put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_68);
    lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
    ::
    put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~put_transaction((put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_68);
  }
  else {
    type._7_1_ = 0;
    type_storage = (runtime_type<> *)0x0;
    prVar3 = detail::
             LFQueue_Base<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>
             ::type_after_control((ControlBlock *)local_48);
    local_80 = prVar3;
    rVar4 = runtime_type<>::make<std::__cxx11::string>();
    prVar3->m_feature_table = rVar4.m_feature_table;
    iVar2 = *i_construction_params;
    cVar1 = *push_data.m_user_storage;
    type_storage = prVar3;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)push_data.m_next_ptr,(long)iVar2,cVar1,&local_81);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
    lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
    ::
    put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::put_transaction(&local_b8,0,
                      (lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                       *)this,(Allocation *)local_48);
    put_transaction<std::__cxx11::string>::put_transaction<std::__cxx11::string,void>
              ((put_transaction<std::__cxx11::string> *)__return_storage_ptr__,&local_b8);
    lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
    ::
    put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~put_transaction(&local_b8);
  }
  return __return_storage_ptr__;
}

Assistant:

put_transaction<ELEMENT_TYPE>
          try_start_emplace(progress_guarantee i_progress_guarantee, CONSTRUCTION_PARAMS &&... i_construction_params) noexcept(
            noexcept(ELEMENT_TYPE(std::forward<CONSTRUCTION_PARAMS>(i_construction_params)...)) &&
            noexcept(runtime_type(runtime_type::template make<ELEMENT_TYPE>())))
        {
            auto push_data = Base::template try_inplace_allocate<
              detail::LfQueue_Busy,
              true,
              detail::size_of<ELEMENT_TYPE>::value,
              alignof(ELEMENT_TYPE)>(i_progress_guarantee);
            if (push_data.m_user_storage == nullptr)
            {
                return put_transaction<ELEMENT_TYPE>();
            }

            constexpr bool is_noexcept =
              std::is_nothrow_constructible<ELEMENT_TYPE, CONSTRUCTION_PARAMS...>::value &&
              noexcept(runtime_type(runtime_type::template make<ELEMENT_TYPE>()));

            runtime_type * type = nullptr;

            if (is_noexcept)
            {
                auto const type_storage = Base::type_after_control(push_data.m_control_block);
                DENSITY_ASSUME(type_storage != nullptr);
                type = new (type_storage) runtime_type(runtime_type::template make<ELEMENT_TYPE>());

                DENSITY_ASSUME(push_data.m_user_storage != nullptr);
                new (push_data.m_user_storage)
                  ELEMENT_TYPE(std::forward<CONSTRUCTION_PARAMS>(i_construction_params)...);
            }
            else
            {
                try
                {
                    auto const type_storage = Base::type_after_control(push_data.m_control_block);
                    DENSITY_ASSUME(type_storage != nullptr);
                    type =
                      new (type_storage) runtime_type(runtime_type::template make<ELEMENT_TYPE>());

                    DENSITY_ASSUME(push_data.m_user_storage != nullptr);
                    new (push_data.m_user_storage)
                      ELEMENT_TYPE(std::forward<CONSTRUCTION_PARAMS>(i_construction_params)...);
                }
                catch (...)
                {
                    if (type != nullptr)
                        type->RUNTIME_TYPE::~RUNTIME_TYPE();

                    Base::cancel_put_nodestroy_impl(push_data);
                    DENSITY_INTERNAL_RETHROW_FROM_NOEXCEPT
                }
            }

            return put_transaction<ELEMENT_TYPE>(PrivateType(), this, push_data);
        }